

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  istream *piVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  long *plVar10;
  ulong uVar11;
  ostream *poVar12;
  runtime_error *prVar13;
  long *plVar14;
  long lVar15;
  unsigned_short port;
  string imp;
  string line;
  string tag;
  char *toks;
  size_t id;
  char buf [256];
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  char local_1d8 [16];
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  char *local_148;
  undefined8 local_140;
  char local_138 [264];
  
  local_168 = local_158;
  local_160 = 0;
  local_158[0] = 0;
  local_1e8 = local_1d8;
  local_1e0 = 0;
  local_1d8[0] = '\0';
  if (argc < 2) {
    pcVar8 = "localhost";
  }
  else {
    pcVar8 = argv[1];
  }
  iVar2 = 0xffff;
  if (2 < argc) {
    iVar2 = atoi(argv[2]);
  }
  port = 0x67ae;
  if (0x401 < (iVar2 + 1U & 0xffff)) {
    port = (unsigned_short)iVar2;
  }
  iVar2 = open_socket(pcVar8,port);
  local_140 = 0;
  sVar5 = send(iVar2,&local_140,8,0);
  if ((int)sVar5 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not perform handshake!",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Could not perform handshake!");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = 0;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '`');
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_1e8,cVar1);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      close(iVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Went through the data by doing ",0x1f);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," queries",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      if (local_168 != local_158) {
        operator_delete(local_168);
      }
      return 0;
    }
    std::__cxx11::string::append((char *)&local_1e8);
    pcVar8 = local_1e8;
    lVar15 = (long)(int)local_1e0;
    pcVar7 = strchr(local_1e8,0x20);
    sVar5 = send(iVar2,pcVar7 + 1,(size_t)(pcVar8 + (lVar15 - (long)(pcVar7 + 1))),0);
    if ((int)sVar5 < 0) break;
    uVar3 = recvall(iVar2,local_138,0x100);
    local_138[uVar3] = '\0';
    local_148 = local_138;
    strsep(&local_148," ");
    pcVar8 = strsep(&local_148," ");
    local_208 = &local_1f8;
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"\'empty","");
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar8,pcVar8 + sVar9);
    }
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_208);
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
    pcVar8 = strsep(&local_148,"\n");
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      local_188[0] = local_178;
      sVar9 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,pcVar8,pcVar8 + sVar9);
      plVar10 = (long *)std::__cxx11::string::append((char *)local_188);
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_198 = *plVar14;
        lStack_190 = plVar10[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar14;
        local_1a8 = (long *)*plVar10;
      }
      local_1a0 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_168);
      local_1c8 = &local_1b8;
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_1b8 = *plVar14;
        lStack_1b0 = plVar10[3];
      }
      else {
        local_1b8 = *plVar14;
        local_1c8 = (long *)*plVar10;
      }
      local_1c0 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      plVar14 = plVar10 + 2;
      if ((long *)*plVar10 == plVar14) {
        local_1f8 = *plVar14;
        lStack_1f0 = plVar10[3];
        local_208 = &local_1f8;
      }
      else {
        local_1f8 = *plVar14;
        local_208 = (long *)*plVar10;
      }
      local_200 = plVar10[1];
      *plVar10 = (long)plVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8);
      }
      if (local_188[0] != local_178) {
        operator_delete(local_188[0]);
      }
      uVar11 = std::__cxx11::string::find_first_of((char *)&local_1e8,0x103079,0);
      std::__cxx11::string::replace((ulong)&local_1e8,uVar11,(char *)0x1,(ulong)local_208);
      sVar5 = send(iVar2,local_1e8,(long)(int)local_1e0,0);
      if ((int)sVar5 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Could not send labeled data!",0x1c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"Could not send labeled data!");
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      recvall(iVar2,local_138,0x100);
      if (local_208 != &local_1f8) {
        operator_delete(local_208);
      }
      iVar4 = iVar4 + 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Could not send unlabeled data!",0x1e);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar13,"Could not send unlabeled data!");
  __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[])
{
  char buf[256];
  char *toks, *itok, *ttag;
  string tag;
  const char* host = "localhost";
  unsigned short port = ~0;
  ssize_t pos;
  int s, ret, queries = 0;
  string line;

  if (argc > 1)
  {
    host = argv[1];
  }
  if (argc > 2)
  {
    port = atoi(argv[2]);
  }
  if (port <= 1024 || port == (unsigned short)(~0))
  {
    port = 26542;
  }

  s = open_socket(host, port);
  size_t id = 0;
  ret = send(s, &id, sizeof(id), 0);
  if (ret < 0)
  {
    const char* msg = "Could not perform handshake!";
    cerr << msg << endl;
    throw runtime_error(msg);
  }

  while (getline(cin, line))
  {
    line.append("\n");
    int len = line.size();
    const char* cstr = line.c_str();
    const char* sp = strchr(cstr, ' ');
    ret = send(s, sp + 1, len - (sp + 1 - cstr), 0);
    if (ret < 0)
    {
      const char* msg = "Could not send unlabeled data!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    ret = recvall(s, buf, 256);
    if (ret < 0)
    {
      const char* msg = "Could not receive queries!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    buf[ret] = '\0';
    toks = &buf[0];
    strsep(&toks, " ");
    ttag = strsep(&toks, " ");
    tag = ttag ? string(ttag) : string("'empty");
    itok = strsep(&toks, "\n");
    if (itok == nullptr || itok[0] == '\0')
    {
      continue;
    }

    queries += 1;
    string imp = string(itok) + " " + tag + " |";
    pos = line.find_first_of("|");
    line.replace(pos, 1, imp);
    cstr = line.c_str();
    len = line.size();
    ret = send(s, cstr, len, 0);
    if (ret < 0)
    {
      const char* msg = "Could not send labeled data!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    ret = recvall(s, buf, 256);
    if (ret < 0)
    {
      const char* msg = "Could not receive predictions!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
  }
  close(s);
  cout << "Went through the data by doing " << queries << " queries" << endl;
  return 0;
}